

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void load(char *filename)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  uint extraout_EDX;
  ulong uVar3;
  
  iVar1 = 0x10210c;
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      uVar3 = 0;
      do {
        __isoc99_fscanf(__stream,"%d",C + uVar3);
        iVar1 = feof(__stream);
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (iVar1 == 0);
    }
    fclose(__stream);
    return;
  }
  load_cold_1();
  iVar2 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  if (0 < (int)extraout_EDX) {
    uVar3 = 0;
    do {
      H[uVar3 + (long)(iVar2 >> 2)] = (int)filename[uVar3];
      uVar3 = uVar3 + 1;
    } while (extraout_EDX != uVar3);
  }
  H[(int)((iVar2 >> 2) + extraout_EDX)] = 0;
  return;
}

Assistant:

void load(char *filename) {
	FILE *fd; unsigned int i = 0;
	fd = fopen(filename, "r");
	if (fd == NULL) { 
		fprintf(stderr,"error opening file\n"); 
		getchar();
		exit(-1);
	}
	while (!feof(fd)) {
		fscanf(fd,"%d", &C[i++]);
	}
	//fprintf(stderr,"loaded %d instructions\n", i-1);
	fclose(fd);
}